

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Connection_receiveChunksBlocking
          (UA_Connection *connection,UA_ByteString *chunks,UA_Boolean *realloced,UA_UInt32 timeout)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined1 local_60 [8];
  timespec ts;
  
  clock_gettime(4,(timespec *)local_60);
  _Var2 = ts.tv_sec;
  lVar6 = (long)local_60 * 10000000;
  *realloced = false;
  UVar3 = (*connection->recv)(connection,chunks,timeout);
  UVar4 = UA_Connection_completeMessages(connection,chunks,realloced);
  uVar5 = UVar4 | UVar3;
  if ((uVar5 == 0) && (chunks->length == 0)) {
    lVar6 = lVar6 + (ulong)timeout * 10000 + _Var2 / 100;
    ts.tv_nsec = (__syscall_slong_t)realloced;
    while( true ) {
      clock_gettime(4,(timespec *)local_60);
      lVar7 = ts.tv_sec / 100 + (long)local_60 * 10000000;
      if (lVar6 < lVar7) break;
      auVar1 = SEXT816(lVar6 - lVar7) * SEXT816(0x346dc5d63886594b);
      UVar3 = (*connection->recv)(connection,chunks,
                                  (int)(auVar1._8_8_ >> 0xb) - (auVar1._12_4_ >> 0x1f));
      UVar4 = UA_Connection_completeMessages(connection,chunks,(UA_Boolean *)ts.tv_nsec);
      if ((UVar4 | UVar3) != 0) {
        return UVar4 | UVar3;
      }
      if (chunks->length != 0) {
        return 0;
      }
    }
    uVar5 = 0xaa0000;
  }
  return uVar5;
}

Assistant:

UA_StatusCode
UA_Connection_receiveChunksBlocking(UA_Connection *connection, UA_ByteString *chunks,
                                    UA_Boolean *realloced, UA_UInt32 timeout) {
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_DateTime maxDate = now + (timeout * UA_MSEC_TO_DATETIME);
    *realloced = false;

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    while(true) {
        /* Listen for messages to arrive */
        retval = connection->recv(connection, chunks, timeout);

        /* Get complete chunks and return */
        retval |= UA_Connection_completeMessages(connection, chunks, realloced);
        if(retval != UA_STATUSCODE_GOOD || chunks->length > 0)
            break;

        /* We received a message. But the chunk is incomplete. Compute the
         * remaining timeout. */
        now = UA_DateTime_nowMonotonic();
        if(now > maxDate)
            return UA_STATUSCODE_GOODNONCRITICALTIMEOUT;
        timeout = (UA_UInt32)((maxDate - now) / UA_MSEC_TO_DATETIME);
    }
    return retval;
}